

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  double *pdVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint local_38;
  
  piVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
  lVar4 = (this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
  iVar11 = piVar3[partitionIndex];
  lVar9 = (long)iVar11;
  iVar2 = piVar3[(long)partitionIndex + 1];
  iVar11 = iVar11 * 4;
  do {
    if (iVar2 <= lVar9) {
      return;
    }
    uVar7 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    auVar14 = ZEXT816(0) << 0x40;
    iVar6 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
    uVar7 = ~((int)uVar7 >> 0x1f) & uVar7;
    uVar8 = uVar7;
    iVar10 = iVar11;
    while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = destP[iVar10];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = destP[(long)iVar10 + 1];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = destP[(long)iVar10 + 2];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = destP[(long)iVar10 + 3];
      iVar10 = iVar10 + iVar6;
      auVar14 = vmaxsd_avx(auVar19,auVar14);
      auVar14 = vmaxsd_avx(auVar20,auVar14);
      auVar14 = vmaxsd_avx(auVar17,auVar14);
      auVar14 = vmaxsd_avx(auVar16,auVar14);
    }
    uVar5 = vcmpsd_avx512f(auVar14,ZEXT816(0),0);
    bVar12 = (bool)((byte)uVar5 & 1);
    dVar13 = (double)((ulong)bVar12 * 0x3ff0000000000000 + (ulong)!bVar12 * auVar14._0_8_);
    dVar15 = 1.0 / dVar13;
    iVar10 = iVar11;
    while (bVar12 = uVar7 != 0, uVar7 = uVar7 - 1, bVar12) {
      pdVar1 = destP + iVar10;
      auVar18._0_8_ = dVar15 * *pdVar1;
      auVar18._8_8_ = dVar15 * pdVar1[1];
      auVar18._16_8_ = dVar15 * pdVar1[2];
      auVar18._24_8_ = dVar15 * pdVar1[3];
      *(undefined1 (*) [32])(destP + iVar10) = auVar18;
      iVar10 = iVar10 + iVar6;
    }
    local_38 = (uint)lVar4;
    if ((local_38 >> 10 & 1) == 0) {
      scaleFactors[lVar9] = dVar13;
      if (cumulativeScaleFactors != (double *)0x0) {
        dVar13 = log(dVar13);
LAB_00133837:
        cumulativeScaleFactors[lVar9] = dVar13 + cumulativeScaleFactors[lVar9];
      }
    }
    else {
      dVar13 = log(dVar13);
      scaleFactors[lVar9] = dVar13;
      if (cumulativeScaleFactors != (double *)0x0) goto LAB_00133837;
    }
    lVar9 = lVar9 + 1;
    iVar11 = iVar11 + 4;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}